

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

bool __thiscall
google::
dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::unserialize<google::sparsehash_internal::pod_serializer<int>,StringIO>(void *param_1)

{
  bool bVar1;
  int bit;
  uchar bits;
  size_type i;
  size_type new_num_buckets;
  MagicNumberType magic_read;
  StringIO *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  uint in_stack_ffffffffffffffcc;
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffd0;
  string *psVar3;
  StringIO *in_stack_ffffffffffffffd8;
  long local_20;
  bool local_1;
  
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::clear((dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)param_1);
  bVar1 = sparsehash_internal::read_bigendian_number<StringIO,unsigned_long>
                    (in_stack_ffffffffffffffd8,(unsigned_long *)in_stack_ffffffffffffffd0,
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (bVar1) {
    if (local_20 == 0x13578642) {
      bVar1 = sparsehash_internal::read_bigendian_number<StringIO,unsigned_long>
                        (in_stack_ffffffffffffffd8,(unsigned_long *)in_stack_ffffffffffffffd0,
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (bVar1) {
        dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        ::clear_to_size(in_stack_ffffffffffffffd0,
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        bVar1 = sparsehash_internal::read_bigendian_number<StringIO,unsigned_long>
                          (in_stack_ffffffffffffffd8,(unsigned_long *)in_stack_ffffffffffffffd0,
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        if (bVar1) {
          for (psVar3 = (string *)0x0; psVar3 < *(string **)((long)param_1 + 0x58);
              psVar3 = (string *)&psVar3->_M_string_length) {
            bVar1 = sparsehash_internal::read_data<StringIO>
                              ((StringIO *)param_1,in_stack_ffffffffffffffb8,0xf8a86c);
            if (!bVar1) {
              return false;
            }
            for (iVar2 = 0; iVar2 < 8; iVar2 = iVar2 + 1) {
              if (((&psVar3->_M_dataplus + iVar2 < *(undefined1 **)((long)param_1 + 0x58)) &&
                  ((in_stack_ffffffffffffffcc >> 0x18 & 1 << ((byte)iVar2 & 0x1f)) != 0)) &&
                 (bVar1 = sparsehash_internal::pod_serializer<int>::operator()
                                    ((pod_serializer<int> *)param_1,in_stack_ffffffffffffffb8,
                                     (int *)0xf8a8e6), !bVar1)) {
                return false;
              }
            }
          }
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool unserialize(ValueSerializer serializer, INPUT* fp) {
    assert(settings.use_empty() && "empty_key not set for read");

    clear();  // just to be consistent
    MagicNumberType magic_read;
    if (!sparsehash_internal::read_bigendian_number(fp, &magic_read, 4))
      return false;
    if (magic_read != MAGIC_NUMBER) {
      return false;
    }
    size_type new_num_buckets;
    if (!sparsehash_internal::read_bigendian_number(fp, &new_num_buckets, 8))
      return false;
    clear_to_size(new_num_buckets);
    if (!sparsehash_internal::read_bigendian_number(fp, &num_elements, 8))
      return false;

    // Read the bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits;
      if (!sparsehash_internal::read_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && (bits & (1 << bit))) {  // not empty
          if (!serializer(fp, &table[i + bit])) return false;
        }
      }
    }
    return true;
  }